

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void async_sign_ctx_free(ptls_async_job_t *_self)

{
  int iVar1;
  int ret;
  undefined1 local_1c [4];
  
  if (_self[2].destroy_ != (_func_void_st_ptls_async_job_t_ptr *)0x0) {
    do {
      iVar1 = ASYNC_start_job(_self + 2,_self[1].set_completion_callback,local_1c,0,0,0);
    } while (iVar1 == 2);
  }
  EVP_MD_CTX_free(_self[1].get_fd);
  ASYNC_WAIT_CTX_free(_self[1].set_completion_callback);
  free(_self);
  return;
}

Assistant:

static void async_sign_ctx_free(ptls_async_job_t *_self)
{
    struct async_sign_ctx *self = (void *)_self;

    /* Once the async operation is complete, the user might call `ptls_free` instead of `ptls_handshake`. In such case, to avoid
     * desynchronization, let the backend read the result from the socket. The code below is a loop, but it is not going to block;
     * it is the responsibility of the user to refrain from calling `ptls_free` until the asynchronous operation is complete. */
    if (self->job != NULL) {
        int ret;
        while (ASYNC_start_job(&self->job, self->waitctx, &ret, NULL, NULL, 0) == ASYNC_PAUSE)
            ;
    }

    EVP_MD_CTX_destroy(self->ctx);
    ASYNC_WAIT_CTX_free(self->waitctx);
    free(self);
}